

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall diligent_spirv_cross::Compiler::analyze_non_block_pointer_types(Compiler *this)

{
  ParsedIR *this_00;
  uint uVar1;
  ID id;
  size_t sVar2;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  ulong uVar5;
  uint *puVar6;
  bool bVar7;
  SPIRFunction *func;
  SPIRType *type;
  long lVar8;
  __node_base _Var9;
  PhysicalStorageBufferPointerHandler handler;
  LoopLock local_f0;
  PhysicalStorageBufferPointerHandler local_e8;
  
  local_e8.non_block_types._M_h._M_buckets = &local_e8.non_block_types._M_h._M_single_bucket;
  local_e8.super_OpcodeHandler._vptr_OpcodeHandler =
       (_func_int **)&PTR__PhysicalStorageBufferPointerHandler_00b70f90;
  local_e8.non_block_types._M_h._M_bucket_count = 1;
  local_e8.non_block_types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8.non_block_types._M_h._M_element_count = 0;
  local_e8.non_block_types._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8.non_block_types._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8.non_block_types._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e8.physical_block_type_meta._M_h._M_buckets =
       &local_e8.physical_block_type_meta._M_h._M_single_bucket;
  local_e8.physical_block_type_meta._M_h._M_bucket_count = 1;
  local_e8.physical_block_type_meta._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8.physical_block_type_meta._M_h._M_element_count = 0;
  local_e8.physical_block_type_meta._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8.physical_block_type_meta._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8.physical_block_type_meta._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e8.access_chain_to_physical_block._M_h._M_buckets =
       &local_e8.access_chain_to_physical_block._M_h._M_single_bucket;
  local_e8.access_chain_to_physical_block._M_h._M_bucket_count = 1;
  local_e8.access_chain_to_physical_block._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8.access_chain_to_physical_block._M_h._M_element_count = 0;
  local_e8.access_chain_to_physical_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8.access_chain_to_physical_block._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8.access_chain_to_physical_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e8.compiler = this;
  func = Variant::get<diligent_spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_e8.super_OpcodeHandler);
  this_00 = &this->ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->ir).ids_for_type[1].
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->ir).ids_for_type[1].
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
    lVar8 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar8);
      pVVar4 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeType) {
        type = Variant::get<diligent_spirv_cross::SPIRType>(pVVar4 + uVar1);
        id.id = (type->super_IVariant).self.id;
        if (id.id == uVar1) {
          bVar7 = ParsedIR::has_decoration(this_00,id,Block);
          if (!bVar7) {
            bVar7 = ParsedIR::has_decoration(this_00,(ID)(type->super_IVariant).self.id,BufferBlock)
            ;
            if (!bVar7) goto LAB_007c9b9b;
          }
          PhysicalStorageBufferPointerHandler::analyze_non_block_types_from_block(&local_e8,type);
        }
      }
LAB_007c9b9b:
      lVar8 = lVar8 + 4;
    } while (sVar2 << 2 != lVar8);
  }
  ParsedIR::LoopLock::~LoopLock(&local_f0);
  SmallVector<unsigned_int,_8UL>::reserve
            (&this->physical_storage_non_block_pointer_types,
             local_e8.non_block_types._M_h._M_element_count);
  for (_Var9._M_nxt = local_e8.non_block_types._M_h._M_before_begin._M_nxt;
      _Var9._M_nxt != (_Hash_node_base *)0x0; _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
    uVar1 = *(uint *)&_Var9._M_nxt[1]._M_nxt;
    SmallVector<unsigned_int,_8UL>::reserve
              (&this->physical_storage_non_block_pointer_types,
               (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.
               buffer_size + 1);
    sVar2 = (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.
            buffer_size;
    (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.ptr[sVar2] =
         uVar1;
    (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.buffer_size =
         sVar2 + 1;
  }
  uVar5 = (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.
          buffer_size;
  if (uVar5 != 0) {
    puVar6 = (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.ptr;
    lVar8 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar6,puVar6 + uVar5,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar6,puVar6 + uVar5);
  }
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->physical_storage_type_to_alignment)._M_h,
                   &local_e8.physical_block_type_meta);
  local_e8.super_OpcodeHandler._vptr_OpcodeHandler =
       (_func_int **)&PTR__PhysicalStorageBufferPointerHandler_00b70f90;
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_e8.access_chain_to_physical_block._M_h);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_e8.physical_block_type_meta._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_e8.non_block_types._M_h);
  return;
}

Assistant:

void Compiler::analyze_non_block_pointer_types()
{
	PhysicalStorageBufferPointerHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	// Analyze any block declaration we have to make. It might contain
	// physical pointers to POD types which we never used, and thus never added to the list.
	// We'll need to add those pointer types to the set of types we declare.
	ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
		// Only analyze the raw block struct, not any pointer-to-struct, since that's just redundant.
		if (type.self == id &&
		    (has_decoration(type.self, DecorationBlock) ||
		     has_decoration(type.self, DecorationBufferBlock)))
		{
			handler.analyze_non_block_types_from_block(type);
		}
	});

	physical_storage_non_block_pointer_types.reserve(handler.non_block_types.size());
	for (auto type : handler.non_block_types)
		physical_storage_non_block_pointer_types.push_back(type);
	sort(begin(physical_storage_non_block_pointer_types), end(physical_storage_non_block_pointer_types));
	physical_storage_type_to_alignment = std::move(handler.physical_block_type_meta);
}